

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O2

size_t err_throw_v(err_id_t error_code,int param_count,__va_list_tag *va,CVmException *exc)

{
  textchar_t *ptVar1;
  uint uVar2;
  err_param_type eVar3;
  char *pcVar4;
  ushort *puVar5;
  err_param_type *peVar6;
  int *piVar7;
  unsigned_long *puVar8;
  undefined8 *puVar9;
  size_t *psVar10;
  size_t sVar11;
  ulong uVar12;
  char *ret;
  void *pvVar13;
  CVmExcParam *pCVar14;
  anon_union_16_5_0471ed35_for_val_ *paVar15;
  int iVar16;
  long in_FS_OFFSET;
  bool bVar17;
  CVmExcParam *local_48;
  size_t local_40;
  
  if (exc == (CVmException *)0x0) {
    local_48 = (CVmExcParam *)0x0;
    pCVar14 = (CVmExcParam *)0x0;
  }
  else {
    exc->error_code_ = error_code;
    exc->param_count_ = param_count;
    *(undefined4 *)((long)&exc->funcset_ + 4) = 0;
    *(undefined8 *)&exc->version_flag_ = 0;
    *(undefined8 *)((long)&exc->metaclass_ + 4) = 0;
    puVar5 = *(ushort **)(in_FS_OFFSET + -8);
    if ((*puVar5 & 0x4003) != 0) {
      free(*(void **)(puVar5 + 8));
      puVar5 = *(ushort **)(in_FS_OFFSET + -8);
    }
    *(CVmException **)(puVar5 + 8) = exc;
    pCVar14 = exc->params_;
    local_48 = exc->params_ + param_count;
  }
  local_40 = (long)param_count * 0x18 + 0x20;
  iVar16 = 0;
  if (0 < param_count) {
    iVar16 = param_count;
  }
  paVar15 = &pCVar14->val_;
  do {
    bVar17 = iVar16 == 0;
    iVar16 = iVar16 + -1;
    if (bVar17) {
      if (exc != (CVmException *)0x0) {
        err_throw_current();
      }
      return local_40;
    }
    uVar2 = va->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      peVar6 = (err_param_type *)((ulong)uVar2 + (long)va->reg_save_area);
      va->gp_offset = uVar2 + 8;
    }
    else {
      peVar6 = (err_param_type *)va->overflow_arg_area;
      va->overflow_arg_area = peVar6 + 2;
    }
    eVar3 = *peVar6;
    if (exc != (CVmException *)0x0) {
      ((CVmExcParam *)((long)paVar15 + -8))->type_ = eVar3;
    }
    switch(eVar3) {
    case ERR_TYPE_INT:
      uVar2 = va->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar7 = (int *)((ulong)uVar2 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 8;
      }
      else {
        piVar7 = (int *)va->overflow_arg_area;
        va->overflow_arg_area = piVar7 + 2;
      }
      if (exc != (CVmException *)0x0) {
        paVar15->intval_ = *piVar7;
      }
      break;
    case ERR_TYPE_ULONG:
      uVar2 = va->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (unsigned_long *)((ulong)uVar2 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (unsigned_long *)va->overflow_arg_area;
        va->overflow_arg_area = puVar8 + 1;
      }
      if (exc != (CVmException *)0x0) {
        paVar15->ulong_ = *puVar8;
      }
      break;
    case ERR_TYPE_TEXTCHAR:
    case ERR_TYPE_CHAR:
      uVar2 = va->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (undefined8 *)((ulong)uVar2 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (undefined8 *)va->overflow_arg_area;
        va->overflow_arg_area = puVar9 + 1;
      }
      pcVar4 = (char *)*puVar9;
      sVar11 = strlen(pcVar4);
      local_40 = local_40 + sVar11 + 1;
      if (exc != (CVmException *)0x0) {
        memcpy(local_48,pcVar4,sVar11);
        *(textchar_t *)((long)&local_48->type_ + sVar11) = '\0';
        paVar15->strval_ = (textchar_t *)local_48;
LAB_002729f2:
        local_48 = (CVmExcParam *)((long)&local_48->type_ + sVar11 + 1);
      }
      break;
    case ERR_TYPE_TEXTCHAR_LEN:
      uVar2 = va->gp_offset;
      uVar12 = (ulong)uVar2;
      if (uVar12 < 0x29) {
        va->gp_offset = (uint)(uVar12 + 8);
        pvVar13 = *(void **)((long)va->reg_save_area + uVar12);
        if (0x20 < uVar2) goto LAB_00272848;
        psVar10 = (size_t *)(uVar12 + 8 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar9 = (undefined8 *)va->overflow_arg_area;
        va->overflow_arg_area = puVar9 + 1;
        pvVar13 = (void *)*puVar9;
LAB_00272848:
        psVar10 = (size_t *)va->overflow_arg_area;
        va->overflow_arg_area = psVar10 + 1;
      }
      sVar11 = *psVar10;
      local_40 = local_40 + sVar11 + 1;
      if (exc != (CVmException *)0x0) {
        ((CVmExcParam *)((long)paVar15 + -8))->type_ = ERR_TYPE_TEXTCHAR;
        memcpy(local_48,pvVar13,sVar11);
        ptVar1 = (textchar_t *)((long)&local_48->type_ + sVar11);
        *ptVar1 = '\0';
        paVar15->strval_ = (textchar_t *)local_48;
LAB_0027299d:
        local_48 = (CVmExcParam *)(ptVar1 + 1);
      }
      break;
    case ERR_TYPE_CHAR_LEN:
      uVar2 = va->gp_offset;
      uVar12 = (ulong)uVar2;
      if (uVar12 < 0x29) {
        va->gp_offset = (uint)(uVar12 + 8);
        pvVar13 = *(void **)((long)va->reg_save_area + uVar12);
        if (0x20 < uVar2) goto LAB_00272949;
        psVar10 = (size_t *)(uVar12 + 8 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar9 = (undefined8 *)va->overflow_arg_area;
        va->overflow_arg_area = puVar9 + 1;
        pvVar13 = (void *)*puVar9;
LAB_00272949:
        psVar10 = (size_t *)va->overflow_arg_area;
        va->overflow_arg_area = psVar10 + 1;
      }
      sVar11 = *psVar10;
      local_40 = local_40 + sVar11 + 1;
      if (exc != (CVmException *)0x0) {
        memcpy(local_48,pvVar13,sVar11);
        ptVar1 = (textchar_t *)((long)&local_48->type_ + sVar11);
        *ptVar1 = '\0';
        paVar15->strval_ = (textchar_t *)local_48;
        ((CVmExcParam *)((long)paVar15 + -8))->type_ = ERR_TYPE_CHAR;
        goto LAB_0027299d;
      }
      break;
    case ERR_TYPE_METACLASS:
      uVar2 = va->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (undefined8 *)((ulong)uVar2 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (undefined8 *)va->overflow_arg_area;
        va->overflow_arg_area = puVar9 + 1;
      }
      pcVar4 = (char *)*puVar9;
      sVar11 = strlen(pcVar4);
      local_40 = local_40 + sVar11 + 1;
      if (exc != (CVmException *)0x0) {
        memcpy(local_48,pcVar4,sVar11);
        *(textchar_t *)((long)&local_48->type_ + sVar11) = '\0';
        exc->metaclass_ = (char *)local_48;
        goto LAB_002729f2;
      }
      break;
    case ERR_TYPE_FUNCSET:
      uVar2 = va->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (undefined8 *)((ulong)uVar2 + (long)va->reg_save_area);
        va->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (undefined8 *)va->overflow_arg_area;
        va->overflow_arg_area = puVar9 + 1;
      }
      pcVar4 = (char *)*puVar9;
      sVar11 = strlen(pcVar4);
      local_40 = local_40 + sVar11 + 1;
      if (exc != (CVmException *)0x0) {
        memcpy(local_48,pcVar4,sVar11);
        *(textchar_t *)((long)&local_48->type_ + sVar11) = '\0';
        exc->funcset_ = (char *)local_48;
        goto LAB_002729f2;
      }
      break;
    case ERR_TYPE_VERSION_FLAG:
      if (exc != (CVmException *)0x0) {
        exc->version_flag_ = 1;
      }
    }
    paVar15 = (anon_union_16_5_0471ed35_for_val_ *)((long)paVar15 + 0x18);
  } while( true );
}

Assistant:

static size_t err_throw_v(err_id_t error_code, int param_count, va_list va,
                          CVmException *exc)
{
    /*
     *   Assert that the size of the err_param_type enum is no larger than
     *   the size of the native 'int' type.  Since this routine is called
     *   with a varargs list, and since ANSI requires compilers to promote
     *   any enum type smaller than int to int when passing to a varargs
     *   function, we must retrieve our err_param_type arguments (via the
     *   va_arg() macro) with type 'int' rather than type 'enum
     *   err_param_type'.
     *   
     *   The promotion to int is mandatory, so retrieving our values as
     *   'int' values is the correct, portable thing to do; the only
     *   potential problem is that our enum type could be defined to be
     *   *larger* than int, in which case the compiler would pass it to us
     *   as the larger type, not int, and our retrieval would be incorrect.
     *   The only way a compiler would be allowed to do this is if our enum
     *   type actually required a type larger than unsigned int (in other
     *   words, we had enum values higher than the largest unsigned int
     *   value for the local platform).  This is extremely unlikely, but
     *   we'll assert our assumption here to ensure that the problem is
     *   readily apparent should it ever occur.  
     */
    assert(sizeof(err_param_type) <= sizeof(int));

    /* 
     *   Figure out how much space we need.  Start with the size of the base
     *   CVmException class, since we always need a CVmException structure.
     *   This structure has space for one argument descriptor built in, so
     *   subtract that off from our base size, since we'll add in space for
     *   the argument descriptors separately.  
     */
    size_t siz = sizeof(CVmException) - sizeof(CVmExcParam);

    /* 
     *   Add in space the parameter descriptors.  We need one CVmExcParam
     *   structure to describe each parameter.  
     */
    siz += param_count * sizeof(CVmExcParam);

    /* fill in our base structure, if allocated */
    CVmExcParam *param = 0;
    char *strspace = 0;
    if (exc != 0)
    {
        /* set the error code and parameter count */
        exc->error_code_ = error_code;
        exc->param_count_ = param_count;

        /* presume this is not an out-of-date version error */
        exc->version_flag_ = FALSE;
        exc->metaclass_ = 0;
        exc->funcset_ = 0;

        /*
         *   If the current stack frame is already handling an error, delete
         *   the current frame's exception object, since the current frame
         *   will no longer be accessible after this throw.  
         */
        if (os_tls_get(err_frame_t *, G_err_frame)->state_
            & (ERR_STATE_EXCEPTION | ERR_STATE_CAUGHT | ERR_STATE_RETHROWN))
            t3free(os_tls_get(err_frame_t *, G_err_frame)->exc_);
        
        /* this is now the current exception */
        os_tls_get(err_frame_t *, G_err_frame)->exc_ = exc;

        /* start at the first parameter slot */
        param = exc->params_;

        /* 
         *   store strings in the allocated space after the base struct and
         *   (varying-size) parameter array 
         */
        strspace = (char *)&exc->params_[param_count];
    }

    /* 
     *   We now have our base exception structure, with enough space for the
     *   parameter descriptors, but we still need to store the parameter
     *   values themselves.
     */
    for (int i = 0 ; i < param_count ; ++i, ++param)
    {
        /* get the type indicator, and store it in the descriptor */
        err_param_type typ = (err_param_type)va_arg(va, int);
        
        /* store the type */
        if (exc != 0)
            param->type_ = typ;

        /* store the argument's value */
        int ival;
        ulong ulval;
        const char *sptr;
        size_t slen;
        switch(typ)
        {
        case ERR_TYPE_INT:
            /* store the integer */
            ival = va_arg(va, int);
            if (exc != 0)
                param->val_.intval_ = ival;
            break;

        case ERR_TYPE_ULONG:
            /* store the unsigned long */
            ulval = va_arg(va, unsigned long);
            if (exc != 0)
                param->val_.ulong_ = ulval;
            break;

        case ERR_TYPE_TEXTCHAR:
            /* 
             *   It's a (textchar_t *) string, null-terminated.  Get the
             *   string pointer and calculate its length. 
             */
            sptr = va_arg(va, textchar_t *);
            slen = get_strlen(sptr);

            /* count the string space needed */
            siz += slen + 1;

            /* store it in parameter memory */
            if (exc != 0)
                param->val_.strval_ = err_store_str(strspace, sptr, slen);
            break;

        case ERR_TYPE_TEXTCHAR_LEN:
            /* 
             *   It's a (textchar_t *) string with an explicit length given
             *   as a separate size_t parameter. 
             */
            sptr = va_arg(va, textchar_t *);
            slen = va_arg(va, size_t);

            /* count the string space */
            siz += slen + 1;

            /* store it in parameter memory */
            if (exc != 0)
            {
                param->type_ = ERR_TYPE_TEXTCHAR;
                param->val_.strval_ = err_store_str(strspace, sptr, slen);
            }

            break;

        case ERR_TYPE_CHAR:
            /* it's a (char *) string, null-terminated */
            sptr = va_arg(va, char *);
            slen = strlen(sptr);

            /* count the string space */
            siz += slen + 1;

            /* store it */
            if (exc != 0)
                param->val_.charval_ = err_store_str(strspace, sptr, slen);
            break;

        case ERR_TYPE_CHAR_LEN:
            /* it's a (char *) string with an explicit size_t size */
            sptr = va_arg(va, char *);
            slen = va_arg(va, size_t);

            /* count the string space */
            siz += slen + 1;

            /* store it */
            if (exc != 0)
            {
                param->val_.charval_ = err_store_str(strspace, sptr, slen);
                param->type_ = ERR_TYPE_CHAR;
            }
            break;

        case ERR_TYPE_FUNCSET:
            /* 
             *   It's a char* string with a function set ID.  These are not
             *   stored in the parameters, but go in the funcset_ slot in the
             *   exception object. 
             */
            sptr = va_arg(va, char *);
            siz += strlen(sptr) + 1;
            if (exc != 0)
                exc->funcset_ = err_store_str(strspace, sptr, strlen(sptr));
            break;

        case ERR_TYPE_METACLASS:
            /* 
             *   It's a char* string with a metaclass ID.  These are not
             *   stored in the parameters, but go in the metaclass_ slot in
             *   the exception object.  
             */
            sptr = va_arg(va, char *);
            siz += strlen(sptr) + 1;
            if (exc != 0)
                exc->metaclass_ = err_store_str(strspace, sptr, strlen(sptr));
            break;

        case ERR_TYPE_VERSION_FLAG:
            /* 
             *   This parameter is a flag indicating that the error is due to
             *   an out-of-date interpreter build.  This has no parameter
             *   data; we simply set the flag in the exception to indicate
             *   the version error type.  
             */
            if (exc != 0)
                exc->version_flag_ = TRUE;
            break;
        }
    }

    /* 
     *   if we have an exception, throw it; if not, we're doing a dry run to
     *   compute the exception object size, so simply return the computed
     *   size 
     */
    if (exc != 0)
    {
        /* throw the exception object that we just populated */
        err_throw_current();
        VMERR_AFTER_ERR_THROW(return 0;)
    }
    else
    {
        /* we're only computing the size on this pass */
        return siz;
    }
}